

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

_Bool is_in_array(int *hay,size_t length,int needle)

{
  byte in_CL;
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = length != 0;
  if (bVar3) {
    iVar2 = *hay;
    in_CL = 1;
    if (iVar2 != needle) {
      uVar1 = 1;
      do {
        if (needle < iVar2) {
          in_CL = 0;
          break;
        }
        bVar3 = uVar1 < length;
        if (uVar1 == length) break;
        iVar2 = hay[uVar1];
        uVar1 = uVar1 + 1;
      } while (iVar2 != needle);
    }
  }
  return (_Bool)(bVar3 & in_CL);
}

Assistant:

bool is_in_array(const int* hay, const size_t length, const int needle) {
  for (size_t n = 0; n < length; n++) {
    if (hay[n] == needle) return true;
    else if (hay[n] > needle) return false;
  }
  return false;
}